

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

void __thiscall btGeneric6DofConstraint::calcAnchorPos(btGeneric6DofConstraint *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  float fVar6;
  
  fVar1 = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
  fVar6 = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
  uVar5 = -(uint)(fVar6 == 0.0);
  fVar1 = (float)(uVar5 & 0x3f800000 | ~uVar5 & (uint)(fVar1 / (fVar1 + fVar6)));
  fVar6 = 1.0 - fVar1;
  uVar2 = *(undefined8 *)(this->m_calculatedTransformA).m_origin.m_floats;
  uVar3 = *(undefined8 *)(this->m_calculatedTransformB).m_origin.m_floats;
  auVar4._4_4_ = fVar6 * (float)((ulong)uVar3 >> 0x20) + fVar1 * (float)((ulong)uVar2 >> 0x20);
  auVar4._0_4_ = fVar6 * (float)uVar3 + fVar1 * (float)uVar2;
  auVar4._8_4_ = (this->m_calculatedTransformB).m_origin.m_floats[2] * fVar6 +
                 (this->m_calculatedTransformA).m_origin.m_floats[2] * fVar1;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_AnchorPos).m_floats = auVar4;
  return;
}

Assistant:

void btGeneric6DofConstraint::calcAnchorPos(void)
{
	btScalar imA = m_rbA.getInvMass();
	btScalar imB = m_rbB.getInvMass();
	btScalar weight;
	if(imB == btScalar(0.0))
	{
		weight = btScalar(1.0);
	}
	else
	{
		weight = imA / (imA + imB);
	}
	const btVector3& pA = m_calculatedTransformA.getOrigin();
	const btVector3& pB = m_calculatedTransformB.getOrigin();
	m_AnchorPos = pA * weight + pB * (btScalar(1.0) - weight);
	return;
}